

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_process_active(event_base *base)

{
  int max_to_process;
  int iVar1;
  int limit_after_prio;
  int maxcb;
  timeval tv;
  timeval *endtime;
  int c;
  int i;
  evcallback_list *activeq;
  event_base *base_local;
  
  endtime._0_4_ = 0;
  max_to_process = base->max_dispatch_callbacks;
  iVar1 = base->limit_callbacks_after_prio;
  if ((base->max_dispatch_time).tv_sec < 0) {
    tv.tv_usec = 0;
  }
  else {
    update_time_cache(base);
    gettime(base,(timeval *)&limit_after_prio);
    _limit_after_prio = (base->max_dispatch_time).tv_sec + _limit_after_prio;
    tv.tv_sec = (base->max_dispatch_time).tv_usec + tv.tv_sec;
    if (999999 < tv.tv_sec) {
      _limit_after_prio = _limit_after_prio + 1;
      tv.tv_sec = tv.tv_sec + -1000000;
    }
    tv.tv_usec = (__suseconds_t)&limit_after_prio;
  }
  for (endtime._4_4_ = 0; endtime._4_4_ < base->nactivequeues; endtime._4_4_ = endtime._4_4_ + 1) {
    if (base->activequeues[endtime._4_4_].tqh_first != (event_callback *)0x0) {
      base->event_running_priority = endtime._4_4_;
      if (endtime._4_4_ < iVar1) {
        endtime._0_4_ =
             event_process_active_single_queue
                       (base,base->activequeues + endtime._4_4_,0x7fffffff,(timeval *)0x0);
      }
      else {
        endtime._0_4_ =
             event_process_active_single_queue
                       (base,base->activequeues + endtime._4_4_,max_to_process,(timeval *)tv.tv_usec
                       );
      }
      if (((int)endtime < 0) || (0 < (int)endtime)) break;
    }
  }
  base->event_running_priority = -1;
  return (int)endtime;
}

Assistant:

static int
event_process_active(struct event_base *base)
{
	/* Caller must hold th_base_lock */
	struct evcallback_list *activeq = NULL;
	int i, c = 0;
	const struct timeval *endtime;
	struct timeval tv;
	const int maxcb = base->max_dispatch_callbacks;
	const int limit_after_prio = base->limit_callbacks_after_prio;
	if (base->max_dispatch_time.tv_sec >= 0) {
		update_time_cache(base);
		gettime(base, &tv);
		evutil_timeradd(&base->max_dispatch_time, &tv, &tv);
		endtime = &tv;
	} else {
		endtime = NULL;
	}

	for (i = 0; i < base->nactivequeues; ++i) {
		if (TAILQ_FIRST(&base->activequeues[i]) != NULL) {
			base->event_running_priority = i;
			activeq = &base->activequeues[i];
			if (i < limit_after_prio)
				c = event_process_active_single_queue(base, activeq,
				    INT_MAX, NULL);
			else
				c = event_process_active_single_queue(base, activeq,
				    maxcb, endtime);
			if (c < 0) {
				goto done;
			} else if (c > 0)
				break; /* Processed a real event; do not
					* consider lower-priority events */
			/* If we get here, all of the events we processed
			 * were internal.  Continue. */
		}
	}

done:
	base->event_running_priority = -1;

	return c;
}